

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O3

void __thiscall QMakeProperty::unsetProperty(QMakeProperty *this,QStringList *optionProperties)

{
  char cVar1;
  QString *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QAnyStringView QVar4;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QString local_70;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((optionProperties->d).size != 0) {
    pQVar2 = (optionProperties->d).ptr;
    do {
      local_70.d.d = (pQVar2->d).d;
      local_70.d.ptr = (pQVar2->d).ptr;
      local_70.d.size = (pQVar2->d).size;
      if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_70.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_70.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar3.m_data = (storage_type *)0x1;
      QVar3.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar3);
      local_88 = local_58;
      uStack_80 = uStack_50;
      local_78 = local_48;
      cVar1 = QString::startsWith(&local_70,(CaseSensitivity)&local_88);
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,0x10);
        }
      }
      if (cVar1 == '\0') {
        initSettings(this);
        QVar4.m_size = (size_t)local_70.d.ptr;
        QVar4.field_0 =
             (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
             (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->settings;
        QSettings::remove(QVar4);
      }
      if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = pQVar2 + 1;
    } while (pQVar2 != (optionProperties->d).ptr + (optionProperties->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeProperty::unsetProperty(const QStringList &optionProperties)
{
    for (auto it = optionProperties.cbegin(); it != optionProperties.cend(); ++it) {
        QString var = (*it);
        if (!var.startsWith("."))
            remove(var);
    }
}